

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# I2sAnalyzerResults.cpp
# Opt level: O0

void __thiscall
I2sAnalyzerResults::GenerateBubbleText
          (I2sAnalyzerResults *this,U64 frame_index,Channel *param_2,DisplayBase display_base)

{
  char *pcVar1;
  char local_4e8 [8];
  char bits_per_word [32];
  stringstream local_4a8 [8];
  stringstream ss_1;
  ostream local_498 [376];
  longlong local_320;
  S64 signed_number_1;
  char number_str_1 [128];
  stringstream local_278 [8];
  stringstream ss;
  ostream local_268 [392];
  longlong local_e0;
  S64 signed_number;
  char number_str [128];
  Frame local_50 [8];
  Frame frame;
  ulonglong local_40;
  undefined1 local_30;
  DisplayBase display_base_local;
  Channel *param_2_local;
  U64 frame_index_local;
  I2sAnalyzerResults *this_local;
  
  AnalyzerResults::ClearResultStrings();
  AnalyzerResults::GetFrame((ulonglong)local_50);
  switch(local_30) {
  case 0:
    if ((display_base == Decimal) && (this->mSettings->mSigned == SignedInteger)) {
      local_e0 = AnalyzerHelpers::ConvertToSignedNumber(local_40,this->mSettings->mBitsPerWord);
      std::__cxx11::stringstream::stringstream(local_278);
      std::ostream::operator<<(local_268,local_e0);
      std::__cxx11::stringstream::str();
      pcVar1 = (char *)std::__cxx11::string::c_str();
      strcpy((char *)&signed_number,pcVar1);
      std::__cxx11::string::~string((string *)(number_str_1 + 0x78));
      std::__cxx11::stringstream::~stringstream(local_278);
    }
    else {
      AnalyzerHelpers::GetNumberString
                (local_40,display_base,this->mSettings->mBitsPerWord,(char *)&signed_number,0x80);
    }
    AnalyzerResults::AddResultString
              ((char *)this,"1",(char *)0x0,(char *)0x0,(char *)0x0,(char *)0x0);
    AnalyzerResults::AddResultString
              ((char *)this,"Ch 1",(char *)0x0,(char *)0x0,(char *)0x0,(char *)0x0);
    AnalyzerResults::AddResultString
              ((char *)this,"Ch 1: ",(char *)&signed_number,(char *)0x0,(char *)0x0,(char *)0x0);
    break;
  case 1:
    if ((display_base == Decimal) && (this->mSettings->mSigned == SignedInteger)) {
      local_320 = AnalyzerHelpers::ConvertToSignedNumber(local_40,this->mSettings->mBitsPerWord);
      std::__cxx11::stringstream::stringstream(local_4a8);
      std::ostream::operator<<(local_498,local_320);
      std::__cxx11::stringstream::str();
      pcVar1 = (char *)std::__cxx11::string::c_str();
      strcpy((char *)&signed_number_1,pcVar1);
      std::__cxx11::string::~string((string *)(bits_per_word + 0x18));
      std::__cxx11::stringstream::~stringstream(local_4a8);
    }
    else {
      AnalyzerHelpers::GetNumberString
                (local_40,display_base,this->mSettings->mBitsPerWord,(char *)&signed_number_1,0x80);
    }
    AnalyzerResults::AddResultString
              ((char *)this,"2",(char *)0x0,(char *)0x0,(char *)0x0,(char *)0x0);
    AnalyzerResults::AddResultString
              ((char *)this,"Ch 2",(char *)0x0,(char *)0x0,(char *)0x0,(char *)0x0);
    AnalyzerResults::AddResultString
              ((char *)this,"Ch 2: ",(char *)&signed_number_1,(char *)0x0,(char *)0x0,(char *)0x0);
    break;
  case 2:
    sprintf(local_4e8,"%d",(ulong)this->mSettings->mBitsPerWord);
    AnalyzerResults::AddResultString
              ((char *)this,"!",(char *)0x0,(char *)0x0,(char *)0x0,(char *)0x0);
    AnalyzerResults::AddResultString
              ((char *)this,"Error",(char *)0x0,(char *)0x0,(char *)0x0,(char *)0x0);
    AnalyzerResults::AddResultString
              ((char *)this,"Error: too few bits",(char *)0x0,(char *)0x0,(char *)0x0,(char *)0x0);
    AnalyzerResults::AddResultString
              ((char *)this,"Error: too few bits, expecting ",local_4e8,(char *)0x0,(char *)0x0,
               (char *)0x0);
    break;
  case 3:
    AnalyzerResults::AddResultString
              ((char *)this,"!",(char *)0x0,(char *)0x0,(char *)0x0,(char *)0x0);
    AnalyzerResults::AddResultString
              ((char *)this,"Error",(char *)0x0,(char *)0x0,(char *)0x0,(char *)0x0);
    AnalyzerResults::AddResultString
              ((char *)this,"Error: bits don\'t divide evenly",(char *)0x0,(char *)0x0,(char *)0x0,
               (char *)0x0);
    AnalyzerResults::AddResultString
              ((char *)this,"Error: bits don\'t divide evenly between subframes",(char *)0x0,
               (char *)0x0,(char *)0x0,(char *)0x0);
  }
  Frame::~Frame(local_50);
  return;
}

Assistant:

void I2sAnalyzerResults::GenerateBubbleText( U64 frame_index, Channel& /*channel*/,
                                             DisplayBase display_base ) // unrefereced vars commented out to remove warnings.
{
    ClearResultStrings();
    Frame frame = GetFrame( frame_index );

    switch( I2sResultType( frame.mType ) )
    {
    case Channel1:
    {
        char number_str[ 128 ];
        if( ( display_base == Decimal ) && ( mSettings->mSigned == AnalyzerEnums::SignedInteger ) )
        {
            S64 signed_number = AnalyzerHelpers::ConvertToSignedNumber( frame.mData1, mSettings->mBitsPerWord );
            std::stringstream ss;
            ss << signed_number;
            strcpy( number_str, ss.str().c_str() );
        }
        else
        {
            AnalyzerHelpers::GetNumberString( frame.mData1, display_base, mSettings->mBitsPerWord, number_str, 128 );
        }
        AddResultString( "1" );
        AddResultString( "Ch 1" );
        AddResultString( "Ch 1: ", number_str );
    }
    break;
    case Channel2:
    {
        char number_str[ 128 ];
        if( ( display_base == Decimal ) && ( mSettings->mSigned == AnalyzerEnums::SignedInteger ) )
        {
            S64 signed_number = AnalyzerHelpers::ConvertToSignedNumber( frame.mData1, mSettings->mBitsPerWord );
            std::stringstream ss;
            ss << signed_number;
            strcpy( number_str, ss.str().c_str() );
        }
        else
        {
            AnalyzerHelpers::GetNumberString( frame.mData1, display_base, mSettings->mBitsPerWord, number_str, 128 );
        }
        AddResultString( "2" );
        AddResultString( "Ch 2" );
        AddResultString( "Ch 2: ", number_str );
    }
    break;
    case ErrorTooFewBits:
    {
        char bits_per_word[ 32 ];
        sprintf( bits_per_word, "%d", mSettings->mBitsPerWord );

        AddResultString( "!" );
        AddResultString( "Error" );
        AddResultString( "Error: too few bits" );
        AddResultString( "Error: too few bits, expecting ", bits_per_word );
    }
    break;
    case ErrorDoesntDivideEvenly:
    {
        AddResultString( "!" );
        AddResultString( "Error" );
        AddResultString( "Error: bits don't divide evenly" );
        AddResultString( "Error: bits don't divide evenly between subframes" );
    }
    break;
    }
}